

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::
     checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<unsigned_long> expected)

{
  Exception *pEVar1;
  Exception *pEVar2;
  Exception *pEVar3;
  bool bVar4;
  Fault f;
  Exception *local_40;
  ListElementCount local_34;
  
  pEVar2 = (Exception *)expected._M_len;
  if ((Exception *)(ulong)reader.builder.elementCount == pEVar2) {
    if (pEVar2 != (Exception *)0x0) {
      pEVar1 = (Exception *)0x0;
      pEVar3 = (Exception *)0x1;
      do {
        f.exception = (Exception *)expected._M_array[(long)pEVar1];
        local_40 = *(Exception **)
                    (reader.builder.ptr + ((long)pEVar1 * (ulong)reader.builder.step >> 3));
        if ((f.exception != local_40) && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::log<char_const(&)[28],unsigned_long&,unsigned_long&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
                     (char (*) [28])"failed: expected (a) == (b)",(unsigned_long *)&f,
                     (unsigned_long *)&local_40);
        }
        bVar4 = pEVar3 < pEVar2;
        pEVar1 = pEVar3;
        pEVar3 = (Exception *)(ulong)((int)pEVar3 + 1);
      } while (bVar4);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_40 = pEVar2;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             (unsigned_long *)&local_40,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}